

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O2

void duckdb::CountFunction::CountUpdate
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,data_ptr_t state_p,
               idx_t count)

{
  VectorType VVar1;
  unsigned_long *puVar2;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  VVar1 = inputs->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    FlatVector::VerifyFlatVector(inputs);
    CountFlatUpdateLoop((STATE *)state_p,&inputs->validity,count);
    return;
  }
  if (VVar1 != SEQUENCE_VECTOR) {
    if (VVar1 != CONSTANT_VECTOR) {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
      Vector::ToUnifiedFormat(inputs,count,&local_68);
      CountUpdateLoop((STATE *)state_p,&local_68.validity,count,local_68.sel);
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_68);
      return;
    }
    puVar2 = (inputs->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      return;
    }
  }
  *(idx_t *)state_p = *(long *)state_p + count;
  return;
}

Assistant:

static void CountUpdate(Vector inputs[], AggregateInputData &, idx_t input_count, data_ptr_t state_p, idx_t count) {
		auto &input = inputs[0];
		auto &result = *reinterpret_cast<STATE *>(state_p);
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (!ConstantVector::IsNull(input)) {
				// if the constant is not null increment the state
				result += UnsafeNumericCast<STATE>(count);
			}
			break;
		}
		case VectorType::FLAT_VECTOR: {
			CountFlatUpdateLoop(result, FlatVector::Validity(input), count);
			break;
		}
		case VectorType::SEQUENCE_VECTOR: {
			// sequence vectors cannot have NULL values
			result += UnsafeNumericCast<STATE>(count);
			break;
		}
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			CountUpdateLoop(result, idata.validity, count, *idata.sel);
			break;
		}
		}
	}